

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::nonbasicValue(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *__return_storage_ptr__,
               SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this)

{
  uint uVar1;
  Status SVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pointer pnVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  pointer pnVar12;
  long lVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_b8;
  long local_80;
  cpp_dec_float<50U,_int,_void> local_78;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  
  local_78.fpclass = cpp_dec_float_finite;
  local_78.prec_elem = 10;
  local_78.data._M_elems[0] = 0;
  local_78.data._M_elems[1] = 0;
  local_78.data._M_elems[2] = 0;
  local_78.data._M_elems[3] = 0;
  local_78.data._M_elems[4] = 0;
  local_78.data._M_elems[5] = 0;
  local_78.data._M_elems._24_5_ = 0;
  local_78.data._M_elems[7]._1_3_ = 0;
  local_78.data._M_elems._32_5_ = 0;
  local_78.data._M_elems[9]._1_3_ = 0;
  local_78.exp = 0;
  local_78.neg = false;
  if (this->m_nonbasicValueUpToDate == true) {
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
         *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 8);
    uVar3 = *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems;
    uVar4 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2);
    uVar5 = *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 6);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
         *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4);
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar5;
    *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar3;
    *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar4;
    (__return_storage_ptr__->m_backend).exp = (this->m_nonbasicValue).m_backend.exp;
    (__return_storage_ptr__->m_backend).neg = (this->m_nonbasicValue).m_backend.neg;
    (__return_storage_ptr__->m_backend).fpclass = (this->m_nonbasicValue).m_backend.fpclass;
    pcVar7 = &(this->m_nonbasicValue).m_backend;
  }
  else {
    local_38 = __return_storage_ptr__;
    if (this->theRep == COLUMN) {
      uVar1 = (this->
              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
      uVar9 = (ulong)uVar1;
      if (this->theType == LEAVE) {
        if (0 < (int)uVar1) {
          lVar13 = uVar9 + 1;
          lVar8 = uVar9 * 0x38;
          do {
            uVar9 = uVar9 - 1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[lVar13 + -2];
            if (SVar2 == P_FIXED) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar6 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar8);
LAB_00266b95:
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              pcVar11 = pcVar7;
              if (((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar8) !=
                   &local_b8) && (pcVar11 = &pnVar12[uVar9].m_backend, pcVar7 != &local_b8)) {
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
                local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
                local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar8 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar8 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar8 + 0x30);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar11);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else {
              if (SVar2 == P_ON_LOWER) {
                pnVar6 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar8)
                ;
                pnVar12 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_00266b95;
              }
              if (SVar2 == P_ON_UPPER) {
                pnVar6 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar8)
                ;
                pnVar12 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_00266b95;
              }
            }
            lVar13 = lVar13 + -1;
            lVar8 = lVar8 + -0x38;
          } while (1 < lVar13);
        }
        lVar8 = (long)(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
        if (0 < lVar8) {
          lVar13 = lVar8 + 1;
          lVar10 = lVar8 * 0x38;
          do {
            lVar8 = lVar8 + -1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[lVar13 + -2];
            if (SVar2 == P_FIXED) {
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pnVar6 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10);
LAB_00266c9d:
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              pcVar11 = pcVar7;
              if (((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) !=
                   &local_b8) && (pcVar11 = &pnVar12[lVar8].m_backend, pcVar7 != &local_b8)) {
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
                local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
                local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x30);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar11);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else {
              if (SVar2 == P_ON_LOWER) {
                pnVar6 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar7 = (cpp_dec_float<50U,_int,_void> *)
                         ((long)&pnVar6[-1].m_backend.data + lVar10);
                pnVar12 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .left.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_00266c9d;
              }
              if (SVar2 == P_ON_UPPER) {
                pnVar6 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pcVar7 = (cpp_dec_float<50U,_int,_void> *)
                         ((long)&pnVar6[-1].m_backend.data + lVar10);
                pnVar12 = (this->
                          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .right.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                goto LAB_00266c9d;
              }
            }
            lVar13 = lVar13 + -1;
            lVar10 = lVar10 + -0x38;
          } while (1 < lVar13);
        }
      }
      else {
        if (0 < (int)uVar1) {
          lVar8 = uVar9 + 1;
          lVar13 = uVar9 * 0x38;
          do {
            uVar9 = uVar9 - 1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data[lVar8 + -2];
            if ((SVar2 == P_FIXED) || (SVar2 == P_ON_LOWER)) {
              pnVar6 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->theLCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_00267152:
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar13)
              ;
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              pcVar7 = pcVar11;
              if (((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar13) !=
                   &local_b8) && (pcVar7 = &pnVar12[uVar9].m_backend, pcVar11 != &local_b8)) {
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
                local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
                local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar13 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar13 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar13 + 0x30);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar7);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else if (SVar2 == P_ON_UPPER) {
              pnVar6 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->theUCbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00267152;
            }
            lVar8 = lVar8 + -1;
            lVar13 = lVar13 + -0x38;
          } while (1 < lVar8);
        }
        lVar8 = (long)(this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .set.thenum;
        if (0 < lVar8) {
          lVar13 = lVar8 + 1;
          lVar10 = lVar8 * 0x38;
          do {
            lVar8 = lVar8 + -1;
            SVar2 = (this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data[lVar13 + -2];
            if ((SVar2 == P_FIXED) || (SVar2 == P_ON_LOWER)) {
              pnVar6 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->theURbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_0026724e:
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10)
              ;
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.exp = 0;
              local_b8.neg = false;
              pcVar7 = pcVar11;
              if (((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) !=
                   &local_b8) && (pcVar7 = &pnVar12[lVar8].m_backend, pcVar11 != &local_b8)) {
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 8);
                local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar11->data)._M_elems;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar11->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar11->data)._M_elems + 6);
                local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x30);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                        (&local_b8,pcVar7);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&local_78,&local_b8);
            }
            else if (SVar2 == P_ON_UPPER) {
              pnVar6 = (this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .object.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->theLRbound).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_0026724e;
            }
            lVar13 = lVar13 + -1;
            lVar10 = lVar10 + -0x38;
          } while (1 < lVar13);
        }
      }
    }
    else {
      lVar8 = (long)(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
      if (0 < lVar8) {
        lVar13 = lVar8 + 1;
        lVar10 = lVar8 * 0x38;
        do {
          lVar8 = lVar8 + -1;
          SVar2 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.colstat.data[lVar13 + -2];
          if (SVar2 == D_ON_BOTH) {
            pnVar6 = (this->theLCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10);
            pnVar12 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_80 = lVar8 * 0x38;
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar11 = pcVar7;
            if (((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) !=
                 &local_b8) && (pcVar11 = &pnVar12[lVar8].m_backend, pcVar7 != &local_b8)) {
              uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
              local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
              local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
              local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
              local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x28);
              local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x2c);
              local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar11);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
            pnVar6 = (this->theUCbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10);
            pnVar12 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) !=
                &local_b8) {
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(pnVar12->m_backend).data + local_80);
              goto LAB_00266eb0;
            }
LAB_00266eec:
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.neg = false;
            local_b8.exp = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            pcVar11 = pcVar7;
LAB_00266eef:
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar11);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
          }
          else {
            if (SVar2 == D_ON_LOWER) {
              pnVar6 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_00266d9e:
              pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10);
              if ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) ==
                  &local_b8) goto LAB_00266eec;
              pcVar11 = &pnVar12[lVar8].m_backend;
LAB_00266eb0:
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.neg = false;
              local_b8.exp = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              if (pcVar7 != &local_b8) {
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
                local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
                local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x30);
              }
              goto LAB_00266eef;
            }
            if (SVar2 == D_ON_UPPER) {
              pnVar6 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00266d9e;
            }
          }
          lVar13 = lVar13 + -1;
          lVar10 = lVar10 + -0x38;
        } while (1 < lVar13);
      }
      lVar8 = (long)(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
      if (0 < lVar8) {
        lVar13 = lVar8 + 1;
        lVar10 = lVar8 * 0x38;
        do {
          lVar8 = lVar8 + -1;
          SVar2 = (this->
                  super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thedesc.rowstat.data[lVar13 + -2];
          if (SVar2 == D_ON_BOTH) {
            pnVar6 = (this->theLRbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10);
            pnVar12 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_80 = lVar8 * 0x38;
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            pcVar11 = pcVar7;
            if (((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) !=
                 &local_b8) && (pcVar11 = &pnVar12[lVar8].m_backend, pcVar7 != &local_b8)) {
              uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
              local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
              local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
              local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
              local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x28);
              local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x2c);
              local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar11);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
            pnVar6 = (this->theURbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10);
            pnVar12 = (this->
                      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) !=
                &local_b8) {
              pcVar11 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)&(pnVar12->m_backend).data + local_80);
              goto LAB_00267087;
            }
LAB_002670c3:
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.neg = false;
            local_b8.exp = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            pcVar11 = pcVar7;
LAB_002670c6:
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                      (&local_b8,pcVar11);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_78,&local_b8);
          }
          else {
            if (SVar2 == D_ON_LOWER) {
              pnVar6 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
LAB_00266f78:
              pcVar7 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar6[-1].m_backend.data + lVar10);
              if ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar12[-1].m_backend.data + lVar10) ==
                  &local_b8) goto LAB_002670c3;
              pcVar11 = &pnVar12[lVar8].m_backend;
LAB_00267087:
              local_b8.fpclass = cpp_dec_float_finite;
              local_b8.prec_elem = 10;
              local_b8.neg = false;
              local_b8.exp = 0;
              local_b8.data._M_elems[9]._1_3_ = 0;
              local_b8.data._M_elems._32_5_ = 0;
              local_b8.data._M_elems[7]._1_3_ = 0;
              local_b8.data._M_elems._24_5_ = 0;
              local_b8.data._M_elems[4] = 0;
              local_b8.data._M_elems[5] = 0;
              local_b8.data._M_elems[2] = 0;
              local_b8.data._M_elems[3] = 0;
              local_b8.data._M_elems[0] = 0;
              local_b8.data._M_elems[1] = 0;
              if (pcVar7 != &local_b8) {
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 8);
                local_b8.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.data._M_elems._0_8_ = *(undefined8 *)(pcVar7->data)._M_elems;
                local_b8.data._M_elems._8_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 2);
                local_b8.data._M_elems._16_8_ = *(undefined8 *)((pcVar7->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar7->data)._M_elems + 6);
                local_b8.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_b8.exp = *(int *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x28);
                local_b8.neg = *(bool *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x2c);
                local_b8._48_8_ = *(undefined8 *)((long)&pnVar6[-1].m_backend.data + lVar10 + 0x30);
              }
              goto LAB_002670c6;
            }
            if (SVar2 == D_ON_UPPER) {
              pnVar6 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar12 = (this->
                        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00266f78;
            }
          }
          lVar13 = lVar13 + -1;
          lVar10 = lVar10 + -0x38;
        } while (1 < lVar13);
      }
    }
    if (this->m_nonbasicValueUpToDate == false) {
      *(ulong *)((this->m_nonbasicValue).m_backend.data._M_elems + 8) =
           CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 4) =
           local_78.data._M_elems._16_8_;
      *(ulong *)((this->m_nonbasicValue).m_backend.data._M_elems + 6) =
           CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
      *(undefined8 *)(this->m_nonbasicValue).m_backend.data._M_elems = local_78.data._M_elems._0_8_;
      *(undefined8 *)((this->m_nonbasicValue).m_backend.data._M_elems + 2) =
           local_78.data._M_elems._8_8_;
      (this->m_nonbasicValue).m_backend.exp = local_78.exp;
      (this->m_nonbasicValue).m_backend.neg = local_78.neg;
      (this->m_nonbasicValue).m_backend.fpclass = local_78.fpclass;
      (this->m_nonbasicValue).m_backend.prec_elem = local_78.prec_elem;
      this->m_nonbasicValueUpToDate = true;
    }
    pcVar7 = &local_78;
    *(ulong *)((local_38->m_backend).data._M_elems + 8) =
         CONCAT35(local_78.data._M_elems[9]._1_3_,local_78.data._M_elems._32_5_);
    *(undefined8 *)((local_38->m_backend).data._M_elems + 4) = local_78.data._M_elems._16_8_;
    *(ulong *)((local_38->m_backend).data._M_elems + 6) =
         CONCAT35(local_78.data._M_elems[7]._1_3_,local_78.data._M_elems._24_5_);
    *(undefined8 *)(local_38->m_backend).data._M_elems = local_78.data._M_elems._0_8_;
    *(undefined8 *)((local_38->m_backend).data._M_elems + 2) = local_78.data._M_elems._8_8_;
    (local_38->m_backend).exp = local_78.exp;
    (local_38->m_backend).neg = local_78.neg;
    (local_38->m_backend).fpclass = local_78.fpclass;
    __return_storage_ptr__ = local_38;
  }
  (__return_storage_ptr__->m_backend).prec_elem = pcVar7->prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::nonbasicValue()
   {
      int i;
      StableSum<R> val;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

#ifndef ENABLE_ADDITIONAL_CHECKS

      // if the value is available we don't need to recompute it
      if(m_nonbasicValueUpToDate)
         return m_nonbasicValue;

#endif

      if(rep() == COLUMN)
      {
         if(type() == LEAVE)
         {
            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theUCbound[i] * SPxLPBase<R>::upper(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::upper(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theLCbound[i] * SPxLPBase<R>::lower(i);
                  //@ val += maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lower(i), SPxLPBase<R>::upper(i), this->epsilon()));
                  val += this->maxObj(i) * SPxLPBase<R>::lower(i);
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += theLRbound[i] * SPxLPBase<R>::rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += theURbound[i] * SPxLPBase<R>::lhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(SPxLPBase<R>::lhs(i), SPxLPBase<R>::rhs(i), this->epsilon()));
                  val += this->maxRowObj(i) * SPxLPBase<R>::lhs(i);
                  break;

               default:
                  break;
               }
            }
         }
         else
         {
            assert(type() == ENTER);

            for(i = this->nCols() - 1; i >= 0; --i)
            {
               switch(ds.colStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxObj(i) * theUCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLCbound[i], theUCbound[i], this->epsilon()));
                  val += this->maxObj(i) * theLCbound[i];
                  break;

               default:
                  break;
               }
            }

            for(i = this->nRows() - 1; i >= 0; --i)
            {
               switch(ds.rowStatus(i))
               {
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  val += this->maxRowObj(i) * theLRbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               case SPxBasisBase<R>::Desc::P_FIXED :
                  assert(EQ(theLRbound[i], theURbound[i], this->epsilon()));
                  val += this->maxRowObj(i) * theURbound[i];
                  break;

               default:
                  break;
               }
            }
         }
      }
      else
      {
         assert(rep() == ROW);
         assert(type() == ENTER);

         for(i = this->nCols() - 1; i >= 0; --i)
         {
            switch(ds.colStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theUCbound[i] * this->lower(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLCbound[i] * this->upper(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLCbound[i] * this->upper(i);
               val += theUCbound[i] * this->lower(i);
               break;

            default:
               break;
            }
         }

         for(i = this->nRows() - 1; i >= 0; --i)
         {
            switch(ds.rowStatus(i))
            {
            case SPxBasisBase<R>::Desc::D_ON_UPPER :
               val += theURbound[i] * this->lhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_LOWER :
               val += theLRbound[i] * this->rhs(i);
               break;

            case SPxBasisBase<R>::Desc::D_ON_BOTH :
               val += theLRbound[i] * this->rhs(i);
               val += theURbound[i] * this->lhs(i);
               break;

            default:
               break;
            }
         }
      }

#ifdef ENABLE_ADDITIONAL_CHECKS

      if(m_nonbasicValueUpToDate && NE(m_nonbasicValue, val))
      {
         SPX_MSG_ERROR(std::cerr << "stored nonbasic value: " << m_nonbasicValue
                       << ", correct nonbasic value: " << val
                       << ", violation: " << val - m_nonbasicValue << std::endl;)
         assert(EQrel(m_nonbasicValue, val, 1e-12));
      }

#endif

      if(!m_nonbasicValueUpToDate)
      {
         m_nonbasicValue = R(val);
         m_nonbasicValueUpToDate = true;
      }

      return val;
   }